

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O1

void google::protobuf::internal::WireFormatLite::WriteGroupMaybeToArray
               (int field_number,MessageLite *value,CodedOutputStream *output)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  byte *pbVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  
  uVar7 = field_number << 3;
  pbVar3 = output->cur_;
  if ((output->impl_).end_ <= pbVar3) {
    pbVar3 = io::EpsCopyOutputStream::EnsureSpaceFallback(&output->impl_,pbVar3);
  }
  uVar5 = (ulong)(field_number * 8 + 3);
  output->cur_ = pbVar3;
  if (0x7f < uVar7) {
    do {
      uVar6 = (uint)uVar5;
      *pbVar3 = (byte)uVar5 | 0x80;
      uVar5 = uVar5 >> 7;
      pbVar3 = pbVar3 + 1;
    } while (0x3fff < uVar6);
  }
  *pbVar3 = (byte)uVar5;
  output->cur_ = pbVar3 + 1;
  MessageLite::GetCachedSize(value);
  iVar2 = (*value->_vptr_MessageLite[5])(value,output->cur_,output);
  pbVar3 = (byte *)CONCAT44(extraout_var,iVar2);
  output->cur_ = pbVar3;
  if ((output->impl_).end_ <= pbVar3) {
    pbVar3 = io::EpsCopyOutputStream::EnsureSpaceFallback(&output->impl_,pbVar3);
  }
  uVar4 = uVar7 | 4;
  output->cur_ = pbVar3;
  uVar6 = uVar4;
  if (0x7f < uVar7) {
    do {
      *pbVar3 = (byte)uVar6 | 0x80;
      uVar4 = uVar6 >> 7;
      pbVar3 = pbVar3 + 1;
      bVar1 = 0x3fff < uVar6;
      uVar6 = uVar4;
    } while (bVar1);
  }
  *pbVar3 = (byte)uVar4;
  output->cur_ = pbVar3 + 1;
  return;
}

Assistant:

void WireFormatLite::WriteGroupMaybeToArray(int field_number,
                                            const MessageLite& value,
                                            io::CodedOutputStream* output) {
  WriteTag(field_number, WIRETYPE_START_GROUP, output);
  const int size = value.GetCachedSize();
  WriteSubMessageMaybeToArray(size, value, output);
  WriteTag(field_number, WIRETYPE_END_GROUP, output);
}